

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O1

void Abc_NamStrHashResize(Abc_Nam_t *p)

{
  Vec_Int_t *p_00;
  int Entry;
  int *__ptr;
  uint uVar1;
  int *piVar2;
  int *piVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  size_t __size;
  ulong uVar7;
  
  __ptr = p->pBins;
  if (__ptr == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                  ,0x14f,"void Abc_NamStrHashResize(Abc_Nam_t *)");
  }
  uVar4 = p->nBins * 3 - 1;
  while( true ) {
    do {
      uVar5 = uVar4 + 1;
      uVar1 = uVar4 & 1;
      uVar4 = uVar5;
    } while (uVar1 != 0);
    if (uVar5 < 9) break;
    iVar6 = 5;
    while (uVar5 % (iVar6 - 2U) != 0) {
      uVar1 = iVar6 * iVar6;
      iVar6 = iVar6 + 2;
      if (uVar5 < uVar1) goto LAB_00416bd5;
    }
  }
LAB_00416bd5:
  p->nBins = uVar5;
  piVar2 = (int *)calloc((long)(int)uVar5,4);
  p->pBins = piVar2;
  p_00 = &p->vInt2Handle;
  iVar6 = (p->vInt2Handle).nSize;
  piVar2 = (p->vInt2Handle).pArray;
  (p->vInt2Handle).nCap = 0;
  (p->vInt2Handle).nSize = 0;
  (p->vInt2Handle).pArray = (int *)0x0;
  if (0 < (long)iVar6) {
    piVar3 = (p->vInt2Handle).pArray;
    __size = (ulong)(uint)(iVar6 * 2) << 2;
    if (piVar3 == (int *)0x0) {
      piVar3 = (int *)malloc(__size);
    }
    else {
      piVar3 = (int *)realloc(piVar3,__size);
    }
    (p->vInt2Handle).pArray = piVar3;
    if (piVar3 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = iVar6 * 2;
  }
  Vec_IntPush(p_00,-1);
  (p->vInt2Next).nSize = 0;
  Vec_IntPush(&p->vInt2Next,-1);
  if (1 < iVar6) {
    uVar7 = 1;
    do {
      Entry = piVar2[uVar7];
      piVar3 = Abc_NamStrHashFind(p,p->pStore + Entry,(char *)0x0);
      if (*piVar3 != 0) {
        __assert_fail("*piPlace == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                      ,0x160,"void Abc_NamStrHashResize(Abc_Nam_t *)");
      }
      *piVar3 = (p->vInt2Handle).nSize;
      if (uVar7 != (uint)(p->vInt2Handle).nSize) {
        __assert_fail("Vec_IntSize( &p->vInt2Handle ) == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilNam.c"
                      ,0x162,"void Abc_NamStrHashResize(Abc_Nam_t *)");
      }
      Vec_IntPush(p_00,Entry);
      Vec_IntPush(&p->vInt2Next,0);
      uVar7 = uVar7 + 1;
    } while ((long)iVar6 != uVar7);
  }
  if (piVar2 != (int *)0x0) {
    free(piVar2);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NamStrHashResize( Abc_Nam_t * p )
{
    Vec_Int_t vInt2HandleOld;  char * pThis; 
    int * piPlace, * pBinsOld, iHandleOld, i;//, clk = Abc_Clock();
    assert( p->pBins != NULL );
//    Abc_Print( 1, "Resizing names manager hash table from %6d to %6d. ", p->nBins, Abc_PrimeCudd( 3 * p->nBins ) );
    // replace the table
    pBinsOld = p->pBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // replace the handles array
    vInt2HandleOld = p->vInt2Handle;
    Vec_IntZero( &p->vInt2Handle );
    Vec_IntGrow( &p->vInt2Handle, 2 * Vec_IntSize(&vInt2HandleOld) ); 
    Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntClear( &p->vInt2Next );    Vec_IntPush( &p->vInt2Next, -1 );
    // rehash the entries from the old table
    Vec_IntForEachEntryStart( &vInt2HandleOld, iHandleOld, i, 1 )
    {
        pThis   = Abc_NamHandleToStr( p, iHandleOld );
        piPlace = Abc_NamStrHashFind( p, pThis, NULL );
        assert( *piPlace == 0 );
        *piPlace = Vec_IntSize( &p->vInt2Handle );
        assert( Vec_IntSize( &p->vInt2Handle ) == i );
        Vec_IntPush( &p->vInt2Handle, iHandleOld );
        Vec_IntPush( &p->vInt2Next,   0 );
    }
    Vec_IntErase( &vInt2HandleOld );
    ABC_FREE( pBinsOld );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}